

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  pointer pMVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  pointer pMVar7;
  int *piVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [12];
  Rect RVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  undefined8 *puVar18;
  float *pfVar19;
  pointer pRVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  void *pvVar24;
  void *pvVar25;
  ulong uVar26;
  void *pvVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float in_XMM5_Db;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  vector<int,_std::allocator<int>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  Mat proposals;
  vector<float,_std::allocator<float>_> scores;
  Mat pbs;
  int local_244;
  Proposal *local_240;
  undefined1 local_238 [12];
  float fStack_22c;
  int *local_228;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_218;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  pointer local_1d8;
  undefined8 uStack_1d0;
  uint local_1c8;
  uint uStack_1c4;
  ulong uStack_1c0;
  vector<float,_std::allocator<float>_> local_1b8;
  pointer local_198;
  ulong local_190;
  ulong local_188;
  undefined8 *local_180;
  uint local_178;
  float local_174;
  float local_170;
  float local_16c;
  vector<float,_std::allocator<float>_> local_168;
  undefined4 local_150;
  int local_14c;
  int local_148;
  undefined4 local_144;
  long local_140;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  ulong local_128;
  void *local_120;
  void *local_118;
  undefined8 *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_198 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_f0 = (ulong)local_198->w;
  local_e8 = (ulong)(uint)local_198->h;
  uVar17 = (this->anchors).h;
  local_190 = (ulong)uVar17;
  uVar30 = local_198->h * local_198->w;
  auVar38._4_4_ = -(uint)(uVar17 == 0);
  auVar38._0_4_ = -(uint)(uVar30 == 0);
  auVar38._8_8_ = 0;
  movmskps(3,auVar38 << 0x40);
  local_1e8 = (undefined1  [16])0x0;
  uStack_1d0 = 0x400000003;
  local_1d8 = (pointer)0x4;
  uStack_1c4 = uVar17;
  local_1c8 = uVar30;
  uStack_1c0 = (long)(int)(uVar30 * 4) & 0x3ffffffffffffffc;
  lVar28 = uStack_1c0 * (long)(int)uVar17;
  local_240 = this;
  local_130 = top_blobs;
  if (lVar28 != 0) {
    pvVar15 = malloc(lVar28 * 4 + 0x1c);
    local_1e8._0_8_ = (long)pvVar15 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_1e8._0_8_ - 8) = pvVar15;
    local_1e8._8_8_ = local_1e8._0_8_ + lVar28 * 4;
    *(undefined4 *)local_1e8._8_8_ = 1;
  }
  local_178 = uVar17;
  local_128 = (ulong)uVar30;
  if (0 < (int)uVar17) {
    local_a8 = local_f0 & 0xffffffff;
    lVar28 = local_198[1].cstep * local_198[1].elemsize;
    local_108 = local_198[1].data;
    lVar31 = (long)uStack_1d0._4_4_;
    local_110 = (undefined8 *)local_1e8._0_8_;
    local_f8 = (local_240->anchors).data;
    local_174 = (float)local_240->feat_stride;
    local_e0 = (long)(local_240->anchors).w;
    local_d0 = uStack_1c0 * (long)local_1d8;
    local_b8 = local_f0 * lVar31 * 4;
    local_118 = (void *)(lVar28 * 3 + (long)local_108);
    local_d8 = lVar28 * 4;
    local_c0 = local_f0 * 4;
    local_120 = (void *)((long)local_108 + lVar28 * 2);
    local_100 = (void *)(lVar28 + (long)local_108);
    local_188 = 0;
    do {
      if (0 < (int)local_e8) {
        local_c8 = local_188 * local_e0;
        uVar4 = *(undefined8 *)((long)local_f8 + local_c8 * 4);
        uVar5 = *(undefined8 *)((long)local_f8 + local_c8 * 4 + 8);
        fVar40 = (float)uVar5 - (float)uVar4;
        fVar44 = (float)((ulong)uVar4 >> 0x20);
        fVar41 = (float)((ulong)uVar5 >> 0x20) - fVar44;
        fStack_80 = fVar40 * 0.5;
        fStack_7c = fVar41 * 0.5;
        local_170 = (float)local_240->feat_stride;
        local_180 = local_110;
        uVar29 = 0;
        local_78 = CONCAT44(fVar41,fVar40);
        uStack_70 = 0;
        pvVar15 = local_108;
        pvVar24 = local_118;
        pvVar25 = local_120;
        pvVar27 = local_100;
        fVar46 = fVar44;
        fVar42 = fVar44;
        fVar39 = fVar44;
        local_98 = fVar41;
        fStack_94 = fVar41;
        fStack_90 = fVar41;
        fStack_8c = fVar41;
        fStack_84 = in_XMM5_Db;
        do {
          local_b0 = uVar29;
          if (0 < (int)local_f0) {
            fVar43 = *(float *)((long)local_f8 + local_c8 * 4);
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            uVar29 = 0;
            puVar18 = local_180;
            local_a0 = pvVar24;
            local_68 = fVar44;
            fStack_64 = fVar46;
            fStack_60 = fVar42;
            fStack_5c = fVar39;
            do {
              local_1f8._0_4_ = fVar43;
              local_16c = *(float *)((long)local_a0 + uVar29 * 4);
              local_48._0_4_ = (*(float *)((long)pvVar27 + uVar29 * 4) + 0.5) * fVar41;
              local_48._4_4_ = 0;
              local_48._8_4_ = (*(float *)((long)pvVar15 + uVar29 * 4) + 0.5) * fVar40;
              local_48._12_4_ = 0;
              local_58 = expf(*(float *)((long)pvVar25 + uVar29 * 4));
              fVar40 = expf(local_16c);
              fVar44 = (float)local_48._8_4_ + (float)local_1f8._0_4_;
              fVar46 = (float)local_48._0_4_ + local_68;
              fVar41 = local_58 * fStack_80;
              fVar40 = fVar40 * fStack_7c;
              auVar33._4_4_ = fVar40;
              auVar33._0_4_ = fVar41;
              auVar33._8_4_ = fVar44;
              auVar33._12_4_ = fVar46;
              auVar11._4_8_ = auVar33._8_8_;
              auVar11._0_4_ = fVar40 + local_68 * fStack_84;
              auVar34._0_8_ = auVar11._0_8_ << 0x20;
              auVar34._8_4_ = fVar44 + fVar41;
              auVar34._12_4_ = fVar46 + fVar40;
              *puVar18 = CONCAT44(fVar46 - fVar40,fVar44 - fVar41);
              puVar18[1] = auVar34._8_8_;
              fVar43 = (float)local_1f8._0_4_ + local_170;
              uVar29 = uVar29 + 1;
              puVar18 = (undefined8 *)((long)puVar18 + lVar31 * 4);
              pvVar24 = local_a0;
              fVar40 = (float)local_78;
              in_XMM5_Db = fStack_84;
              fVar41 = local_98;
              fVar44 = local_68;
              fVar46 = fStack_64;
              fVar42 = fStack_60;
              fVar39 = fStack_5c;
            } while (local_a8 != uVar29);
          }
          fVar44 = fVar44 + local_174;
          uVar29 = local_b0 + 1;
          local_180 = (undefined8 *)((long)local_180 + local_b8);
          pvVar24 = (void *)((long)pvVar24 + local_c0);
          pvVar25 = (void *)((long)pvVar25 + local_c0);
          pvVar27 = (void *)((long)pvVar27 + local_c0);
          pvVar15 = (void *)((long)pvVar15 + local_c0);
        } while (uVar29 != local_e8);
      }
      local_188 = local_188 + 1;
      local_110 = (undefined8 *)((long)local_110 + local_d0);
      local_118 = (void *)((long)local_118 + local_d8);
      local_120 = (void *)((long)local_120 + local_d8);
      local_100 = (void *)((long)local_100 + local_d8);
      local_108 = (void *)((long)local_108 + local_d8);
    } while (local_188 != local_190);
  }
  uVar29 = local_128 & 0xffffffff;
  if (0 < (int)local_178) {
    fVar40 = (float)*local_198[2].data;
    fVar41 = (float)((ulong)*local_198[2].data >> 0x20);
    auVar35._0_4_ = fVar41 + -1.0;
    auVar35._4_4_ = fVar40 + -1.0;
    auVar35._8_4_ = fVar41 + -1.0;
    auVar35._12_4_ = fVar40 + -1.0;
    uVar21 = 0;
    pauVar16 = (undefined1 (*) [16])local_1e8._0_8_;
    do {
      uVar22 = uVar29;
      pauVar23 = pauVar16;
      if (0 < (int)local_128) {
        do {
          auVar38 = minps(*pauVar23,auVar35);
          auVar38 = maxps(auVar38,ZEXT816(0));
          *pauVar23 = auVar38;
          pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)uStack_1d0._4_4_ * 4);
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
      }
      uVar21 = uVar21 + 1;
      pauVar16 = (undefined1 (*) [16])(*pauVar16 + uStack_1c0 * (long)local_1d8);
    } while (uVar21 != local_190);
  }
  local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (0 < (int)local_178) {
    local_1f8._0_4_ = (float)local_240->min_size * *(float *)((long)local_198[2].data + 8);
    uVar22 = 0;
    uVar21 = local_190;
    do {
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(uStack_1c0 * uVar22 * (long)local_1d8 + local_1e8._0_8_);
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_1d8;
      local_150 = 2;
      local_14c = uStack_1d0._4_4_;
      local_148 = local_1c8;
      local_144 = 1;
      local_140 = (long)(int)(local_1c8 * uStack_1d0._4_4_);
      if (0 < (int)local_128) {
        pfVar19 = (float *)(local_198->elemsize * local_198->cstep * uVar21 + (long)local_198->data)
        ;
        uVar26 = 0;
        do {
          lVar28 = (long)(int)uVar26 * (long)local_14c;
          if (((float)local_1f8._0_4_ <=
               (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar28 + 2] + 1.0) -
               local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar28]) &&
             ((float)local_1f8._0_4_ <=
              (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar28 + 3] + 1.0) -
              local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar28 + 1])) {
            local_238._4_4_ =
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28 + 1];
            local_238._0_4_ =
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28];
            local_238._8_4_ =
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28 + 2];
            fStack_22c = local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar28 + 3];
            RVar12 = _local_238;
            if (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_218,
                         (iterator)
                         local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_238);
            }
            else {
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 =
                   local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar28];
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_238._4_4_;
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)local_238._8_4_;
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = fStack_22c;
              local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              _local_238 = RVar12;
            }
            if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_1b8,
                         (iterator)
                         local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar19);
            }
            else {
              *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar19;
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar26 = uVar26 + 1;
          pfVar19 = pfVar19 + 1;
        } while (uVar29 != uVar26);
      }
      if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = (float)((int)*local_168.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + -1);
        UNLOCK();
        if ((*local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish == 0.0) &&
           (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          free(*(void **)(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + -2));
        }
      }
      uVar22 = uVar22 + 1;
      uVar21 = uVar21 + 1;
    } while (uVar22 != local_190);
  }
  if (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_218,&local_1b8,0,
                 (int)((ulong)((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar13 = local_240->pre_nms_topN;
  if (0 < (long)iVar13) {
    if (iVar13 < (int)((ulong)((long)local_218.
                                     super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_218.
                                    super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4)) {
      std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_218,(long)iVar13);
      std::vector<float,_std::allocator<float>_>::resize(&local_1b8,(long)local_240->pre_nms_topN);
    }
  }
  local_228 = (int *)0x0;
  local_238._0_4_ = 0.0;
  local_238._4_4_ = 0.0;
  local_238._8_4_ = 0.0;
  fStack_22c = 0.0;
  local_1f8._0_4_ = local_240->nms_thresh;
  uVar17 = (uint)((ulong)((long)local_218.
                                super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_168,(long)(int)uVar17,(allocator_type *)&local_244);
  if ((int)uVar17 < 1) {
    local_244 = 0;
  }
  else {
    pfVar19 = &(local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    uVar29 = 0;
    do {
      uVar3 = ((Rect *)(pfVar19 + -2))->x1;
      uVar6 = ((Rect *)(pfVar19 + -2))->y1;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar29] =
           ((float)((ulong)*(undefined8 *)pfVar19 >> 0x20) - (float)uVar6) *
           ((float)*(undefined8 *)pfVar19 - (float)uVar3);
      uVar29 = uVar29 + 1;
      pfVar19 = pfVar19 + 4;
    } while ((uVar17 & 0x7fffffff) != uVar29);
    local_244 = 0;
    if (0 < (int)uVar17) {
      do {
        uVar30 = (uint)((ulong)((long)stack0xfffffffffffffdd0 - local_238._0_8_) >> 2);
        if ((int)uVar30 < 1) {
LAB_00112ec0:
          if (stack0xfffffffffffffdd0 == local_228) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_238,stack0xfffffffffffffdd0,
                       &local_244);
          }
          else {
            *stack0xfffffffffffffdd0 = local_244;
            stack0xfffffffffffffdd0 = stack0xfffffffffffffdd0 + 1;
          }
        }
        else {
          lVar28 = (long)local_244;
          fVar40 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar28].x1;
          bVar32 = true;
          uVar29 = 0;
          do {
            iVar13 = *(int *)(local_238._0_8_ + uVar29 * 4);
            fVar41 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar13].x2;
            fVar44 = 0.0;
            if (fVar40 <= fVar41) {
              pRVar20 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start + iVar13;
              fVar46 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar28].x2;
              fVar42 = pRVar20->x1;
              if (fVar42 <= fVar46) {
                fVar39 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar28].y1;
                fVar43 = pRVar20->y2;
                if (fVar39 <= fVar43) {
                  fVar2 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar28].y2;
                  fVar45 = pRVar20->y1;
                  if (fVar45 <= fVar2) {
                    if (fVar46 <= fVar41) {
                      fVar41 = fVar46;
                    }
                    if (fVar42 <= fVar40) {
                      fVar42 = fVar40;
                    }
                    if (fVar2 <= fVar43) {
                      fVar43 = fVar2;
                    }
                    if (fVar45 <= fVar39) {
                      fVar45 = fVar39;
                    }
                    fVar44 = (fVar43 - fVar45) * (fVar41 - fVar42);
                  }
                }
              }
            }
            if ((float)local_1f8._0_4_ <
                fVar44 / ((local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28] - fVar44) +
                         local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar13])) {
              bVar32 = false;
            }
            uVar29 = uVar29 + 1;
          } while ((uVar30 & 0x7fffffff) != uVar29);
          if (bVar32) goto LAB_00112ec0;
        }
        local_244 = local_244 + 1;
      } while (local_244 < (int)uVar17);
    }
  }
  if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar17 = (uint)((ulong)((long)stack0xfffffffffffffdd0 - local_238._0_8_) >> 2);
  if (local_240->after_nms_topN < (int)uVar17) {
    uVar17 = local_240->after_nms_topN;
  }
  pMVar7 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar38 = ZEXT416(uVar17);
  auVar36._0_4_ = -(uint)(pMVar7->dims == 3);
  auVar36._4_4_ = -(uint)(pMVar7->w == 4);
  auVar36._8_4_ = -(uint)(pMVar7->h == 1);
  auVar36._12_4_ = -(uint)(uVar17 == pMVar7->c);
  iVar13 = movmskps((int)local_130,auVar36);
  if ((iVar13 != 0xf) || (uVar30 = uVar17, pMVar7->elemsize != 4)) {
    piVar8 = pMVar7->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if ((*piVar8 == 0) && (pMVar7->data != (void *)0x0)) {
        local_1f8 = auVar38;
        free(*(void **)((long)pMVar7->data + -8));
        auVar38 = local_1f8;
      }
    }
    uVar30 = auVar38._0_4_;
    pMVar7->elemsize = 0;
    pMVar7->dims = 0;
    pMVar7->w = 0;
    pMVar7->h = 0;
    pMVar7->c = 0;
    pMVar7->cstep = 0;
    pMVar7->data = (void *)0x0;
    pMVar7->refcount = (int *)0x0;
    pMVar7->elemsize = 4;
    pMVar7->dims = 3;
    pMVar7->w = 4;
    pMVar7->h = 1;
    pMVar7->c = uVar17;
    pMVar7->cstep = 4;
    if (uVar17 != 0) {
      lVar28 = (long)(int)uVar17 * 0x10;
      local_1f8 = auVar38;
      pvVar15 = malloc(lVar28 + 0x1c);
      uVar30 = local_1f8._0_4_;
      pvVar24 = (void *)((long)pvVar15 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar24 - 8) = pvVar15;
      pMVar7->data = pvVar24;
      pMVar7->refcount = (int *)((long)pvVar24 + lVar28);
      *(undefined4 *)((long)pvVar24 + lVar28) = 1;
    }
  }
  iVar13 = -100;
  if ((pMVar7->data != (void *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
    if (0 < (int)uVar17) {
      sVar9 = pMVar7->cstep;
      sVar10 = pMVar7->elemsize;
      pfVar19 = (float *)((long)pMVar7->data + 0xc);
      uVar29 = 0;
      do {
        iVar14 = *(int *)(local_238._0_8_ + uVar29 * 4);
        pfVar19[-3] = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14].x1;
        pfVar19[-2] = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14].y1;
        pfVar19[-1] = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14].x2;
        *pfVar19 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar14].y2;
        uVar29 = uVar29 + 1;
        pfVar19 = (float *)((long)pfVar19 + sVar9 * sVar10);
      } while (uVar17 != uVar29);
    }
    pMVar7 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar28 = (long)(local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar7 >> 4;
    if (1 < (ulong)(lVar28 * -0x5555555555555555)) {
      pMVar1 = pMVar7 + 1;
      auVar37._0_4_ = -(uint)(pMVar7[1].dims == 3);
      auVar37._4_4_ = -(uint)(pMVar7[1].w == 1);
      auVar37._8_4_ = -(uint)(pMVar7[1].h == 1);
      auVar37._12_4_ = -(uint)(uVar30 == pMVar7[1].c);
      iVar14 = movmskps((int)lVar28,auVar37);
      if ((iVar14 != 0xf) || (pMVar7[1].elemsize != 4)) {
        piVar8 = pMVar7[1].refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if ((*piVar8 == 0) && (pMVar1->data != (void *)0x0)) {
            free(*(void **)((long)pMVar1->data + -8));
          }
        }
        pMVar7[1].h = 0;
        pMVar7[1].c = 0;
        pMVar7[1].cstep = 0;
        pMVar7[1].elemsize = 0;
        pMVar7[1].dims = 0;
        pMVar7[1].w = 0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        pMVar7[1].elemsize = 4;
        pMVar7[1].dims = 3;
        pMVar7[1].w = 1;
        pMVar7[1].h = 1;
        pMVar7[1].c = uVar17;
        pMVar7[1].cstep = 4;
        if (uVar17 != 0) {
          lVar28 = (long)(int)uVar17 * 0x10;
          pvVar15 = malloc(lVar28 + 0x1c);
          pvVar24 = (void *)((long)pvVar15 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar24 - 8) = pvVar15;
          pMVar7[1].data = pvVar24;
          pMVar7[1].refcount = (int *)((long)pvVar24 + lVar28);
          *(undefined4 *)((long)pvVar24 + lVar28) = 1;
        }
      }
      if (pMVar1->data == (void *)0x0) {
        bVar32 = true;
      }
      else {
        bVar32 = (long)pMVar7[1].c * pMVar7[1].cstep == 0;
      }
      if (bVar32) goto LAB_001131ef;
      if (0 < (int)uVar17) {
        pfVar19 = (float *)pMVar7[1].data;
        sVar9 = pMVar7[1].cstep;
        sVar10 = pMVar7[1].elemsize;
        uVar29 = 0;
        do {
          *pfVar19 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(int *)(local_238._0_8_ + uVar29 * 4)];
          uVar29 = uVar29 + 1;
          pfVar19 = (float *)((long)pfVar19 + sVar9 * sVar10);
        } while (uVar17 != uVar29);
      }
    }
    iVar13 = 0;
  }
LAB_001131ef:
  if ((void *)local_238._0_8_ != (void *)0x0) {
    operator_delete((void *)local_238._0_8_,(long)local_228 - local_238._0_8_);
  }
  if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((int *)local_1e8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1e8._8_8_ = *(int *)local_1e8._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_1e8._8_8_ == 0) && (local_1e8._0_8_ != 0)) {
      free(*(void **)(local_1e8._0_8_ + -8));
    }
  }
  return iVar13;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}